

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.h
# Opt level: O2

void ipx::ScaleColumn(SparseMatrix *A,Int j,double s)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  Int p;
  long lVar4;
  
  piVar2 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (A->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[(long)j + 1];
  for (lVar4 = (long)piVar2[j]; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pdVar3[lVar4] = pdVar3[lVar4] * s;
  }
  return;
}

Assistant:

Int begin(Int j) const { return colptr_[j]; }